

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.h
# Opt level: O3

int __thiscall XFlatNode::pathIndex(XFlatNode *this,QString *filepath)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QArrayData *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QVar4.m_data = (storage_type *)0x1;
  QVar4.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar4);
  local_68 = local_48;
  uStack_60 = uStack_40;
  local_58 = local_38;
  iVar1 = QString::lastIndexOf
                    ((QString *)filepath,(longlong)&local_68,(CaseSensitivity)(filepath->d).size);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  QVar5.m_data = (storage_type *)0x1;
  QVar5.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar5);
  local_68 = local_48;
  uStack_60 = uStack_40;
  local_58 = local_38;
  iVar2 = QString::lastIndexOf
                    ((QString *)filepath,(longlong)&local_68,(CaseSensitivity)(filepath->d).size);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  iVar3 = iVar2;
  if (iVar2 < iVar1) {
    iVar3 = iVar1;
  }
  if (iVar2 == -1) {
    iVar3 = iVar1;
  }
  if (iVar1 == -1) {
    iVar3 = iVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int pathIndex(const QString &filepath) {
        int Windex = filepath.lastIndexOf("\\");
        int Uindex = filepath.lastIndexOf("/");
        if (Windex != -1 && Uindex != -1)
            return qMax(Windex, Uindex);
        else if (Windex != -1)
            return Windex;
        return Uindex;
    }